

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmbstr.c
# Opt level: O2

tmbstr prvTidytmbstrndup(TidyAllocator *allocator,ctmbstr str,uint len)

{
  char cVar1;
  tmbstr ptVar2;
  long lVar3;
  
  if (len == 0 || str == (ctmbstr)0x0) {
    return (tmbstr)0x0;
  }
  ptVar2 = (tmbstr)(*allocator->vtbl->alloc)(allocator,(long)len + 1);
  lVar3 = 0;
  do {
    if (len == (uint)lVar3) break;
    cVar1 = str[lVar3];
    ptVar2[lVar3] = cVar1;
    lVar3 = lVar3 + 1;
  } while (cVar1 != '\0');
  ptVar2[lVar3] = '\0';
  return ptVar2;
}

Assistant:

tmbstr TY_(tmbstrndup)( TidyAllocator *allocator, ctmbstr str, uint len )
{
    tmbstr s = NULL;
    if ( str && len > 0 )
    {
        tmbstr cp = s = (tmbstr) TidyAlloc( allocator, 1+len );
        while ( len-- > 0 &&  (*cp++ = *str++) )
          /**/;
        *cp = 0;
    }
    return s;
}